

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_apply_to(mpc_parser_t *a,mpc_apply_to_t f,void *x)

{
  mpc_parser_t *pmVar1;
  mpc_parser_t *p;
  void *x_local;
  mpc_apply_to_t f_local;
  mpc_parser_t *a_local;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x10';
  (pmVar1->data).expect.x = a;
  (pmVar1->data).apply_to.f = f;
  (pmVar1->data).apply_to.d = x;
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_apply_to(mpc_parser_t *a, mpc_apply_to_t f, void *x) {
  mpc_parser_t *p = mpc_undefined();
  p->type = MPC_TYPE_APPLY_TO;
  p->data.apply_to.x = a;
  p->data.apply_to.f = f;
  p->data.apply_to.d = x;
  return p;
}